

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.h
# Opt level: O1

BSDFSample * __thiscall
pbrt::ThinDielectricBxDF::Sample_f
          (BSDFSample *__return_storage_ptr__,ThinDielectricBxDF *this,Vector3f wo,Float uc,
          Point2f *u,TransportMode mode,BxDFReflTransFlags sampleFlags)

{
  undefined8 uVar1;
  bool bVar2;
  float fVar3;
  undefined1 auVar4 [16];
  bool bVar5;
  bool bVar6;
  float fVar7;
  float fVar8;
  undefined1 auVar9 [16];
  undefined1 auVar11 [16];
  float fVar12;
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [64];
  float fVar19;
  undefined1 auVar10 [16];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  
  auVar18._4_60_ = wo._12_60_;
  auVar18._0_4_ = wo.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar13._8_56_ = wo._8_56_;
  auVar13._0_8_ = wo.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar10 = auVar18._0_16_;
  bVar5 = auVar18._0_4_ < -1.0;
  auVar16 = SUB6416(ZEXT464(0x3f800000),0);
  auVar9 = vminss_avx(auVar16,auVar10);
  fVar7 = (float)((uint)bVar5 * -0x40800000 + (uint)!bVar5 * auVar9._0_4_);
  bVar6 = 0.0 < fVar7;
  auVar9._8_4_ = 0x7fffffff;
  auVar9._0_8_ = 0x7fffffff7fffffff;
  auVar9._12_4_ = 0x7fffffff;
  auVar9 = vandps_avx512vl(auVar10,auVar9);
  uVar1 = vcmpss_avx512f(auVar16,auVar10,1);
  bVar2 = (bool)((byte)uVar1 & 1);
  fVar12 = auVar9._0_4_;
  auVar11._4_12_ = auVar9._4_12_;
  fVar8 = (float)((uint)bVar6 * (int)this->eta + (uint)!bVar6 * (int)(1.0 / this->eta));
  auVar10 = ZEXT416((uint)fVar8);
  auVar11._0_4_ =
       (uint)bVar6 * (int)fVar7 +
       (uint)!bVar6 *
       ((uint)bVar5 * 0x3f800000 +
       (uint)!bVar5 * ((uint)bVar2 * 0x3f800000 + (uint)!bVar2 * (int)fVar12));
  auVar9 = vfnmadd213ss_fma(auVar11,auVar11,auVar16);
  auVar9 = vmaxss_avx(auVar9,ZEXT816(0) << 0x40);
  if (auVar9._0_4_ < 0.0) {
    auVar14._0_4_ = sqrtf(auVar9._0_4_);
    auVar14._4_60_ = extraout_var;
    auVar9 = auVar14._0_16_;
  }
  else {
    auVar9 = vsqrtss_avx(auVar9,auVar9);
  }
  auVar16._0_4_ = auVar9._0_4_ / fVar8;
  auVar16._4_12_ = auVar9._4_12_;
  auVar9 = SUB6416(ZEXT464(0x3f800000),0);
  if (auVar16._0_4_ < 1.0) {
    auVar9 = vfnmadd213ss_fma(auVar16,auVar16,ZEXT416(0x3f800000));
    auVar9 = vmaxss_avx(auVar9,ZEXT816(0) << 0x40);
    if (auVar9._0_4_ < 0.0) {
      auVar15._0_4_ = sqrtf(auVar9._0_4_);
      auVar15._4_60_ = extraout_var_00;
      auVar9 = auVar15._0_16_;
    }
    else {
      auVar9 = vsqrtss_avx(auVar9,auVar9);
    }
    auVar4 = vfmsub213ss_fma(auVar11,auVar10,auVar9);
    auVar16 = vfmadd213ss_fma(auVar11,auVar10,auVar9);
    auVar17._0_4_ = auVar4._0_4_ / auVar16._0_4_;
    auVar17._4_12_ = auVar4._4_12_;
    auVar16 = vfnmadd213ss_fma(auVar9,auVar10,auVar11);
    auVar9 = vfmadd213ss_fma(auVar9,auVar10,auVar11);
    fVar7 = auVar16._0_4_ / auVar9._0_4_;
    auVar9 = vfmadd231ss_fma(ZEXT416((uint)(fVar7 * fVar7)),auVar17,auVar17);
    auVar9 = ZEXT416((uint)(auVar9._0_4_ * 0.5));
  }
  fVar7 = auVar9._0_4_;
  fVar8 = 1.0 - fVar7;
  if (fVar7 < 1.0) {
    auVar9 = vfnmadd213ss_fma(auVar9,auVar9,SUB6416(ZEXT464(0x3f800000),0));
    fVar7 = fVar7 + (fVar7 * fVar8 * fVar8) / auVar9._0_4_;
    auVar9 = ZEXT416((uint)fVar7);
    fVar8 = 1.0 - fVar7;
  }
  fVar7 = (float)((uint)((byte)sampleFlags & 1) * (int)auVar9._0_4_);
  fVar3 = (float)((uint)((sampleFlags & Transmission) != Unset) * (int)fVar8);
  if (((fVar7 != 0.0) || (fVar3 != 0.0)) || (NAN(fVar3))) {
    fVar19 = fVar7 / (fVar3 + fVar7);
    if (fVar19 <= uc) {
      auVar10._0_8_ = auVar13._0_8_ ^ 0x8000000080000000;
      auVar10._8_4_ = wo.super_Tuple3<pbrt::Vector3,_float>.z ^ 0x80000000;
      auVar10._12_4_ = wo._12_4_ ^ 0x80000000;
      fVar8 = fVar8 / fVar12;
      (__return_storage_ptr__->f).values.values[0] = fVar8;
      (__return_storage_ptr__->f).values.values[1] = fVar8;
      (__return_storage_ptr__->f).values.values[2] = fVar8;
      (__return_storage_ptr__->f).values.values[3] = fVar8;
      uVar1 = vmovlps_avx(auVar10);
      (__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar1;
      (__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.y =
           (float)(int)((ulong)uVar1 >> 0x20);
      (__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.z = -auVar18._0_4_;
      __return_storage_ptr__->pdf = fVar3 / (fVar3 + fVar7);
      __return_storage_ptr__->flags = SpecularTransmission;
    }
    else {
      fVar12 = auVar9._0_4_ / fVar12;
      (__return_storage_ptr__->f).values.values[0] = fVar12;
      (__return_storage_ptr__->f).values.values[1] = fVar12;
      (__return_storage_ptr__->f).values.values[2] = fVar12;
      (__return_storage_ptr__->f).values.values[3] = fVar12;
      auVar4._8_4_ = 0x80000000;
      auVar4._0_8_ = 0x8000000080000000;
      auVar4._12_4_ = 0x80000000;
      auVar9 = vxorps_avx512vl(auVar13._0_16_,auVar4);
      uVar1 = vmovlps_avx(auVar9);
      (__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar1;
      (__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.y =
           (float)(int)((ulong)uVar1 >> 0x20);
      (__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.z = auVar18._0_4_;
      __return_storage_ptr__->pdf = fVar19;
      __return_storage_ptr__->flags = SpecularReflection;
    }
  }
  else {
    (__return_storage_ptr__->f).values.values[0] = 0.0;
    (__return_storage_ptr__->f).values.values[1] = 0.0;
    (__return_storage_ptr__->f).values.values[2] = 0.0;
    (__return_storage_ptr__->f).values.values[3] = 0.0;
    (__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
    (__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
    *(undefined8 *)&(__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.z = 0;
    __return_storage_ptr__->flags = Unset;
  }
  return __return_storage_ptr__;
}

Assistant:

PBRT_CPU_GPU
    BSDFSample Sample_f(Vector3f wo, Float uc, const Point2f &u, TransportMode mode,
                        BxDFReflTransFlags sampleFlags) const {
        Float R = FrDielectric(CosTheta(wo), eta), T = 1 - R;
        // Compute _R_ and _T_ accounting for scattering between interfaces
        if (R < 1) {
            R += T * T * R / (1 - R * R);
            T = 1 - R;
        }

        // Compute probabilities _pr_ and _pt_ for sampling reflection and transmission
        Float pr = R, pt = T;
        if (!(sampleFlags & BxDFReflTransFlags::Reflection))
            pr = 0;
        if (!(sampleFlags & BxDFReflTransFlags::Transmission))
            pt = 0;
        if (pr == 0 && pt == 0)
            return {};

        if (uc < pr / (pr + pt)) {
            // Sample perfect specular reflection at interface
            Vector3f wi(-wo.x, -wo.y, wo.z);
            SampledSpectrum fr(R / AbsCosTheta(wi));
            return BSDFSample(fr, wi, pr / (pr + pt), BxDFFlags::SpecularReflection);

        } else {
            // Sample perfect specular transmission at thin dielectric interface
            Vector3f wi = -wo;
            SampledSpectrum ft(T / AbsCosTheta(wi));
            return BSDFSample(ft, wi, pt / (pr + pt), BxDFFlags::SpecularTransmission);
        }
    }